

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O0

json_string * NumberToString::_itoa<char>(json_string *__return_storage_ptr__,char val)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_45 [20];
  allocator local_31;
  long local_30;
  long value;
  char *pcStack_20;
  bool negative;
  char *runner;
  char num_str_result [5];
  json_string *pjStack_10;
  char val_local;
  
  runner._6_1_ = 0;
  pcStack_20 = (char *)((long)&runner + 5);
  local_30 = (long)val;
  value._7_1_ = local_30 < 0;
  if ((bool)value._7_1_) {
    local_30 = -local_30;
  }
  do {
    pcVar1 = pcStack_20;
    pcVar2 = pcStack_20 + -1;
    *pcStack_20 = (char)(local_30 % 10) + '0';
    local_30 = local_30 / 10;
    pcStack_20 = pcVar2;
  } while (local_30 != 0);
  runner._7_1_ = val;
  pjStack_10 = __return_storage_ptr__;
  if ((bool)value._7_1_) {
    *pcVar2 = '-';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_45);
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _itoa(T val) json_nothrow {		
	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
	   #else
		  json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
	   #endif
	   num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
	   json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];
	   bool negative;

	   START_MEM_SCOPE
	   long value = (long)val;
	   //first thing, check if it's negative, if so, make it positive
	   if (value < 0){
		  value = -value;
		  negative = true;
	   } else {
		  negative = false;
	   }

	   //create the string
	   do {
		  *runner-- = (json_char)(value % 10) + JSON_TEXT('0');
	   } while(value /= 10);
	   END_MEM_SCOPE

	   //if it's negative, add the negation
	   if (negative){
		  *runner = JSON_TEXT('-');
		  return json_string(runner);
	   }
	   return json_string(runner + 1);
    }